

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O0

int element7(PROLOG_STATE *state,int tok,char *UNUSED_ptr,char *UNUSED_end,ENCODING *UNUSED_enc)

{
  ENCODING *UNUSED_enc_local;
  char *UNUSED_end_local;
  char *UNUSED_ptr_local;
  int tok_local;
  PROLOG_STATE *state_local;
  
  switch(tok) {
  case 0xf:
    state_local._4_4_ = 0x27;
    break;
  default:
    state_local._4_4_ = common(state,tok);
    break;
  case 0x15:
    state->handler = element6;
    state_local._4_4_ = 0x31;
    break;
  case 0x18:
    state->level = state->level - 1;
    if (state->level == 0) {
      state->handler = declClose;
      state->role_none = 0x27;
    }
    state_local._4_4_ = 0x2d;
    break;
  case 0x23:
    state->level = state->level - 1;
    if (state->level == 0) {
      state->handler = declClose;
      state->role_none = 0x27;
    }
    state_local._4_4_ = 0x2f;
    break;
  case 0x24:
    state->level = state->level - 1;
    if (state->level == 0) {
      state->handler = declClose;
      state->role_none = 0x27;
    }
    state_local._4_4_ = 0x2e;
    break;
  case 0x25:
    state->level = state->level - 1;
    if (state->level == 0) {
      state->handler = declClose;
      state->role_none = 0x27;
    }
    state_local._4_4_ = 0x30;
    break;
  case 0x26:
    state->handler = element6;
    state_local._4_4_ = 0x32;
  }
  return state_local._4_4_;
}

Assistant:

static int PTRCALL
element7(PROLOG_STATE *state,
         int tok,
         const char *UNUSED_P(ptr),
         const char *UNUSED_P(end),
         const ENCODING *UNUSED_P(enc))
{
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_ELEMENT_NONE;
  case XML_TOK_CLOSE_PAREN:
    state->level -= 1;
    if (state->level == 0) {
      state->handler = declClose;
      state->role_none = XML_ROLE_ELEMENT_NONE;
    }
    return XML_ROLE_GROUP_CLOSE;
  case XML_TOK_CLOSE_PAREN_ASTERISK:
    state->level -= 1;
    if (state->level == 0) {
      state->handler = declClose;
      state->role_none = XML_ROLE_ELEMENT_NONE;
    }
    return XML_ROLE_GROUP_CLOSE_REP;
  case XML_TOK_CLOSE_PAREN_QUESTION:
    state->level -= 1;
    if (state->level == 0) {
      state->handler = declClose;
      state->role_none = XML_ROLE_ELEMENT_NONE;
    }
    return XML_ROLE_GROUP_CLOSE_OPT;
  case XML_TOK_CLOSE_PAREN_PLUS:
    state->level -= 1;
    if (state->level == 0) {
      state->handler = declClose;
      state->role_none = XML_ROLE_ELEMENT_NONE;
    }
    return XML_ROLE_GROUP_CLOSE_PLUS;
  case XML_TOK_COMMA:
    state->handler = element6;
    return XML_ROLE_GROUP_SEQUENCE;
  case XML_TOK_OR:
    state->handler = element6;
    return XML_ROLE_GROUP_CHOICE;
  }
  return common(state, tok);
}